

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOStreamBuffer.h
# Opt level: O0

bool __thiscall
Assimp::IOStreamBuffer<char>::getNextLine
          (IOStreamBuffer<char> *this,vector<char,_std::allocator<char>_> *buffer)

{
  value_type vVar1;
  bool bVar2;
  reference pvVar3;
  size_type local_28;
  size_t i;
  vector<char,_std::allocator<char>_> *buffer_local;
  IOStreamBuffer<char> *this_local;
  
  std::vector<char,_std::allocator<char>_>::resize(buffer,this->m_cacheSize);
  bVar2 = isEndOfCache(this->m_cachePos,this->m_cacheSize);
  if (((!bVar2) && (this->m_filePos != 0)) || (bVar2 = readNextBlock(this), bVar2)) {
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&this->m_cache,this->m_cachePos);
    bVar2 = IsLineEnd<char>(*pvVar3);
    if (bVar2) {
      while (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                                (&this->m_cache,this->m_cachePos), *pvVar3 != '\n') {
        this->m_cachePos = this->m_cachePos + 1;
      }
      this->m_cachePos = this->m_cachePos + 1;
      bVar2 = isEndOfCache(this->m_cachePos,this->m_cacheSize);
      if ((bVar2) && (bVar2 = readNextBlock(this), !bVar2)) {
        return false;
      }
    }
    local_28 = 0;
    do {
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&this->m_cache,this->m_cachePos)
      ;
      bVar2 = IsLineEnd<char>(*pvVar3);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](buffer,local_28);
        *pvVar3 = '\n';
        this->m_cachePos = this->m_cachePos + 1;
        return true;
      }
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&this->m_cache,this->m_cachePos)
      ;
      vVar1 = *pvVar3;
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](buffer,local_28);
      *pvVar3 = vVar1;
      this->m_cachePos = this->m_cachePos + 1;
      local_28 = local_28 + 1;
    } while ((this->m_cachePos < this->m_cacheSize) || (bVar2 = readNextBlock(this), bVar2));
  }
  return false;
}

Assistant:

AI_FORCE_INLINE
bool IOStreamBuffer<T>::getNextLine(std::vector<T> &buffer) {
    buffer.resize(m_cacheSize);
    if ( isEndOfCache( m_cachePos, m_cacheSize ) || 0 == m_filePos) {
       if (!readNextBlock()) {
          return false;
       }
      }

    if (IsLineEnd(m_cache[m_cachePos])) {
        // skip line end
        while (m_cache[m_cachePos] != '\n') {
            ++m_cachePos;
        }
        ++m_cachePos;
        if ( isEndOfCache( m_cachePos, m_cacheSize ) ) {
            if ( !readNextBlock() ) {
                return false;
            }
        }
    }

    size_t i( 0 );
    while (!IsLineEnd(m_cache[ m_cachePos ])) {
        buffer[i] = m_cache[ m_cachePos ];
        ++m_cachePos;
        ++i;
        if (m_cachePos >= m_cacheSize) {
            if (!readNextBlock()) {
                return false;
            }
        }
    }
    buffer[i] = '\n';
    ++m_cachePos;

    return true;
}